

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O2

void __thiscall spvtools::DiagnosticStream::~DiagnosticStream(DiagnosticStream *this)

{
  _Manager_type p_Var1;
  uint uVar2;
  ostream *poVar3;
  spv_message_level_t __args;
  char *local_48;
  
  if ((this->error_ != SPV_FAILED_MATCH) &&
     ((this->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    uVar2 = this->error_ + (SPV_FAILED_MATCH|SPV_END_OF_STREAM);
    if (uVar2 < 0xc) {
      __args = *(spv_message_level_t *)(&DAT_002e8f04 + (ulong)uVar2 * 4);
    }
    else {
      __args = SPV_MSG_ERROR;
    }
    if ((this->disassembled_instruction_)._M_string_length != 0) {
      poVar3 = std::endl<char,std::char_traits<char>>((ostream *)this);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = std::operator<<(poVar3,(string *)&this->disassembled_instruction_);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::__cxx11::stringbuf::str();
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&this->consumer_,__args,"input",&this->position_,local_48);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  p_Var1 = (this->consumer_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->consumer_,(_Any_data *)&this->consumer_,__destroy_functor);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

DiagnosticStream::~DiagnosticStream() {
  if (error_ != SPV_FAILED_MATCH && consumer_ != nullptr) {
    auto level = SPV_MSG_ERROR;
    switch (error_) {
      case SPV_SUCCESS:
      case SPV_REQUESTED_TERMINATION:  // Essentially success.
        level = SPV_MSG_INFO;
        break;
      case SPV_WARNING:
        level = SPV_MSG_WARNING;
        break;
      case SPV_UNSUPPORTED:
      case SPV_ERROR_INTERNAL:
      case SPV_ERROR_INVALID_TABLE:
        level = SPV_MSG_INTERNAL_ERROR;
        break;
      case SPV_ERROR_OUT_OF_MEMORY:
        level = SPV_MSG_FATAL;
        break;
      default:
        break;
    }
    if (disassembled_instruction_.size() > 0)
      stream_ << std::endl << "  " << disassembled_instruction_ << std::endl;

    consumer_(level, "input", position_, stream_.str().c_str());
  }
}